

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O1

MPP_RET mpp_enc_ref_cfg_check(MppEncRefCfg ref)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  MPP_RET MVar5;
  int iVar6;
  int iVar7;
  MPP_RET MVar8;
  MPP_RET MVar9;
  MPP_RET MVar10;
  MPP_RET MVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int *piVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  MppEncRefs refs;
  uint local_6c;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  MppEncRefs local_38;
  
  MVar5 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_check",ref);
  MVar8 = MPP_ERR_VALUE;
  if (MVar5 == MPP_OK) {
    iVar12 = *(int *)((long)ref + 0x1c);
    iVar1 = *(int *)((long)ref + 0x20);
    local_60 = 0;
    if (iVar12 < 1) {
      bVar4 = true;
      local_5c = 0;
      local_54 = 0;
      iVar19 = 0;
    }
    else {
      piVar16 = (int *)(*(long *)((long)ref + 0x28) + 0x14);
      iVar19 = 0;
      local_54 = 0;
      uVar17 = 0;
      local_5c = 0;
      bVar4 = true;
      iVar13 = 1;
      do {
        iVar6 = iVar13 + -1;
        uVar14 = piVar16[-3];
        iVar7 = piVar16[-5];
        iVar2 = piVar16[-4];
        uVar18 = 1 << ((byte)iVar7 & 0x1f);
        if (0xf < iVar7) {
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p lt cfg %d with invalid lt_idx %d larger than MPP_ENC_MAX_LT_REF_NUM\n"
                     ,"mpp_enc_ref_cfg_check",ref,iVar6,iVar7);
          bVar4 = false;
        }
        local_6c = uVar18;
        if ((uVar18 & uVar17) != 0) {
          local_6c = 0;
          _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with redefined lt_idx %d config\n",
                     "mpp_enc_ref_cfg_check",ref,iVar6,iVar7);
          bVar4 = false;
        }
        iVar19 = iVar19 + (uint)((uVar18 & uVar17) == 0);
        if (local_54 < iVar7) {
          local_54 = iVar7;
        }
        if (iVar2 != 0) {
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p lt cfg %d with invalid temporal_id %d is non-zero\n",
                     "mpp_enc_ref_cfg_check",ref,iVar6,iVar2);
          bVar4 = false;
        }
        if ((6 < uVar14) && (uVar14 != 0x19)) {
          _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with invalid ref mode %x\n",
                     "mpp_enc_ref_cfg_check",ref,iVar6,uVar14);
          bVar4 = false;
        }
        if (((bVar4) && (piVar16[-1] != 0)) && (iVar7 = piVar16[-1] + *piVar16, local_5c < iVar7)) {
          local_5c = iVar7;
        }
        if (!bVar4) break;
        uVar17 = uVar17 | local_6c;
        piVar16 = piVar16 + 6;
        bVar3 = iVar13 < iVar12;
        iVar13 = iVar13 + 1;
      } while (bVar3);
    }
    iVar12 = -1;
    if (iVar1 == 0 || !bVar4) {
      local_58 = 0;
    }
    else if (iVar1 < 1) {
      bVar4 = true;
      local_58 = 0;
    }
    else {
      piVar16 = (int *)(*(long *)((long)ref + 0x30) + 0x10);
      bVar4 = true;
      uVar15 = 0;
      local_58 = 0;
      local_60 = 0;
      local_6c = 0;
      iVar12 = 0;
      do {
        iVar13 = piVar16[-3];
        uVar17 = piVar16[-2];
        uVar14 = 1 << ((byte)iVar13 & 0x1f);
        iVar7 = (int)uVar15;
        if (3 < iVar13) {
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p st cfg %d with invalid temporal_id %d larger than MPP_ENC_MAX_TEMPORAL_LAYER_NUM\n"
                     ,"mpp_enc_ref_cfg_check",ref,uVar15,iVar13);
          bVar4 = false;
        }
        if ((6 < uVar17) && (uVar17 != 0x1d)) {
          _mpp_log_l(2,"mpp_enc_ref","ref cfg %p st cfg %d with invalid ref mode %x\n",
                     "mpp_enc_ref_cfg_check",ref,uVar15,uVar17);
          bVar4 = false;
        }
        if (*piVar16 < 0) {
          _mpp_log_l(2,"mpp_enc_ref","ref cfg %p st cfg %d with negative repeat %d set to zero\n",
                     "mpp_enc_ref_cfg_check",ref,uVar15,*piVar16);
          *piVar16 = 0;
        }
        if (iVar1 + -1 == iVar7 || iVar7 == 0) {
          if (piVar16[-4] != 0) {
            _mpp_log_l(2,"mpp_enc_ref",
                       "ref cfg %p st cfg %d with invalid non-ref frame on head/tail frame\n",
                       "mpp_enc_ref_cfg_check",ref,uVar15);
            bVar4 = false;
          }
          if (0 < iVar13) {
            _mpp_log_l(2,"mpp_enc_ref",
                       "ref cfg %p st cfg %d with invalid non-zero temporal id %d on head/tail frame\n"
                       ,"mpp_enc_ref_cfg_check",ref,uVar15,iVar13);
            bVar4 = false;
          }
        }
        if (bVar4) {
          bVar3 = (uVar14 & local_6c) == 0;
          if (!bVar3 || piVar16[-4] != 0) {
            uVar14 = 0;
          }
          local_6c = local_6c | uVar14;
          local_58 = local_58 + (uint)(bVar3 && piVar16[-4] == 0);
          if (local_60 < iVar13) {
            local_60 = iVar13;
          }
          iVar12 = iVar12 + *piVar16 + 1;
        }
        if (!bVar4) break;
        uVar15 = (ulong)(iVar7 + 1U);
        piVar16 = piVar16 + 5;
      } while ((int)(iVar7 + 1U) < iVar1);
      iVar12 = iVar12 + -1;
    }
    if (bVar4) {
      local_38 = (MppEncRefs)0x0;
      *(undefined4 *)((long)ref + 0x38) = 0;
      *(int *)((long)ref + 0x3c) = iVar19;
      *(int *)((long)ref + 0x40) = local_58;
      *(int *)((long)ref + 0x44) = local_54;
      *(int *)((long)ref + 0x48) = local_60;
      *(int *)((long)ref + 0x4c) = local_5c;
      *(int *)((long)ref + 0x50) = iVar12;
      MVar5 = mpp_enc_refs_init(&local_38);
      MVar8 = mpp_enc_refs_set_cfg(local_38,ref);
      MVar9 = mpp_enc_refs_dryrun(local_38);
      MVar10 = mpp_enc_refs_get_cpb_info(local_38,(MppEncCpbInfo *)((long)ref + 0x38));
      MVar11 = mpp_enc_refs_deinit(&local_38);
      uVar17 = (uint)(((MVar9 == MPP_OK && MVar8 == MPP_OK) &&
                      (MVar11 == MPP_OK && MVar10 == MPP_OK)) && MVar5 == MPP_OK);
    }
    else {
      uVar17 = 0;
      _mpp_log_l(2,"mpp_enc_ref","check ref cfg %p failed\n","mpp_enc_ref_cfg_check",ref);
    }
    *(uint *)((long)ref + 8) = uVar17;
    MVar8 = uVar17 + MPP_NOK;
  }
  return MVar8;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_check(MppEncRefCfg ref)
{
    if (check_is_mpp_enc_ref_cfg(ref))
        return MPP_ERR_VALUE;

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)ref;
    RK_S32 lt_cfg_cnt = p->lt_cfg_cnt;
    RK_S32 st_cfg_cnt = p->st_cfg_cnt;
    RK_S32 max_lt_ref_cnt   = 0;
    RK_S32 max_lt_ref_idx   = 0;
    RK_S32 lt_idx_used_mask = 0;
    RK_S32 lt_dryrun_length = 0;
    RK_S32 max_st_ref_cnt   = 0;
    RK_S32 max_st_tid       = 0;
    RK_S32 st_tid_used_mask = 0;
    RK_S32 st_dryrun_length = 0;
    RK_S32 ready = 1;

    /* parse and check gop config for encoder */
    if (lt_cfg_cnt) {
        RK_S32 pos = 0;
        MppEncRefLtFrmCfg *cfg = p->lt_cfg;

        for (pos = 0; pos < lt_cfg_cnt; pos++, cfg++) {
            MppEncRefMode ref_mode = cfg->ref_mode;
            RK_S32 temporal_id = cfg->temporal_id;
            RK_S32 lt_idx = cfg->lt_idx;
            RK_U32 lt_idx_mask = 1 << lt_idx;

            /* check lt idx */
            if (lt_idx >= MPP_ENC_MAX_LT_REF_NUM) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid lt_idx %d larger than MPP_ENC_MAX_LT_REF_NUM\n",
                          ref, pos, lt_idx);
                ready = 0;
            }

            if (lt_idx_used_mask & lt_idx_mask) {
                mpp_err_f("ref cfg %p lt cfg %d with redefined lt_idx %d config\n",
                          ref, pos, lt_idx);
                ready = 0;
            }

            if (!(lt_idx_used_mask & lt_idx_mask)) {
                lt_idx_used_mask |= lt_idx_mask;
                max_lt_ref_cnt++;
            }

            if (lt_idx > max_lt_ref_idx)
                max_lt_ref_idx = lt_idx;

            /* check temporal id */
            if (temporal_id != 0) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid temporal_id %d is non-zero\n",
                          ref, pos, temporal_id);
                ready = 0;
            }

            /* check gop mode */
            if (!REF_MODE_IS_GLOBAL(ref_mode) && !REF_MODE_IS_LT_MODE(ref_mode)) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid ref mode %x\n",
                          ref, pos, ref_mode);
                ready = 0;
            }

            /* if check failed just quit */
            if (!ready)
                break;

            if (cfg->lt_gap && (cfg->lt_gap + cfg->lt_delay > lt_dryrun_length))
                lt_dryrun_length = cfg->lt_gap + cfg->lt_delay;
        }
    }

    /* check st-ref config */
    if (ready && st_cfg_cnt) {
        RK_S32 pos = 0;
        MppEncRefStFrmCfg *cfg = p->st_cfg;

        for (pos = 0; pos < st_cfg_cnt; pos++, cfg++) {
            MppEncRefMode ref_mode = cfg->ref_mode;
            RK_S32 temporal_id = cfg->temporal_id;
            RK_U32 tid_mask = 1 << temporal_id;

            /* check temporal_id */
            if (temporal_id > MPP_ENC_MAX_TEMPORAL_LAYER_NUM - 1) {
                mpp_err_f("ref cfg %p st cfg %d with invalid temporal_id %d larger than MPP_ENC_MAX_TEMPORAL_LAYER_NUM\n",
                          ref, pos, temporal_id);
                ready = 0;
            }

            /* check gop mode */
            if (!REF_MODE_IS_GLOBAL(ref_mode) && !REF_MODE_IS_ST_MODE(ref_mode)) {
                mpp_err_f("ref cfg %p st cfg %d with invalid ref mode %x\n",
                          ref, pos, ref_mode);
                ready = 0;
            }

            if (cfg->repeat < 0) {
                mpp_err_f("ref cfg %p st cfg %d with negative repeat %d set to zero\n",
                          ref, pos, cfg->repeat);
                cfg->repeat = 0;
            }

            /* constrain on head and tail frame */
            if (pos == 0 || (pos == st_cfg_cnt - 1)) {
                if (cfg->is_non_ref) {
                    mpp_err_f("ref cfg %p st cfg %d with invalid non-ref frame on head/tail frame\n",
                              ref, pos);
                    ready = 0;
                }

                if (temporal_id > 0) {
                    mpp_err_f("ref cfg %p st cfg %d with invalid non-zero temporal id %d on head/tail frame\n",
                              ref, pos, temporal_id);
                    ready = 0;
                }
            }

            if (!ready)
                break;

            if (!cfg->is_non_ref && !(st_tid_used_mask & tid_mask)) {
                max_st_ref_cnt++;
                st_tid_used_mask |= tid_mask;
            }

            if (temporal_id > max_st_tid)
                max_st_tid = temporal_id;

            st_dryrun_length++;
            st_dryrun_length += cfg->repeat;
        }
    }

    if (ready) {
        MppEncCpbInfo *cpb_info = &p->cpb_info;
        MppEncRefs refs = NULL;
        MPP_RET ret = MPP_OK;

        cpb_info->dpb_size = 0;
        cpb_info->max_lt_cnt = max_lt_ref_cnt;
        cpb_info->max_st_cnt = max_st_ref_cnt;
        cpb_info->max_lt_idx = max_lt_ref_idx;
        cpb_info->max_st_tid = max_st_tid;
        cpb_info->lt_gop     = lt_dryrun_length;
        cpb_info->st_gop     = st_dryrun_length - 1;

        ret = mpp_enc_refs_init(&refs);
        ready = (ret) ? 0 : (ready);
        ret = mpp_enc_refs_set_cfg(refs, ref);
        ready = (ret) ? 0 : (ready);
        ret = mpp_enc_refs_dryrun(refs);
        ready = (ret) ? 0 : (ready);

        /* update dpb size */
        ret = mpp_enc_refs_get_cpb_info(refs, cpb_info);
        ready = (ret) ? 0 : (ready);

        ret = mpp_enc_refs_deinit(&refs);
        ready = (ret) ? 0 : (ready);
    } else {
        mpp_err_f("check ref cfg %p failed\n", ref);
    }
    p->ready = ready;

    return ready ? MPP_OK : MPP_NOK;
}